

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
solitaire::colliders::TableauPileCollider::tryGetCollidedCardIndex
          (TableauPileCollider *this,Position *position)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  _Optional_payload_base<unsigned_int> _Var3;
  uint index;
  ulong uVar4;
  
  bVar1 = isEmptyOrNotCollidesWithPileXPosition(this,position);
  if (bVar1) {
    _Var3._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var3._M_engaged = false;
    _Var3._5_3_ = 0;
  }
  else {
    iVar2 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[7])();
    index = (uint)((ulong)(((long *)CONCAT44(extraout_var,iVar2))[1] -
                          *(long *)CONCAT44(extraout_var,iVar2)) >> 3);
    uVar4 = 0x100000000;
    do {
      index = index - 1;
      if ((int)index < 0) {
        uVar4 = 0;
        break;
      }
      bVar1 = collidesWithCardYPosition(this,position,index);
    } while (!bVar1);
    _Var3 = (_Optional_payload_base<unsigned_int>)(index | uVar4);
  }
  return (optional<unsigned_int>)_Var3;
}

Assistant:

std::optional<unsigned>
TableauPileCollider::tryGetCollidedCardIndex(const Position& position) const {
    if (isEmptyOrNotCollidesWithPileXPosition(position))
        return std::nullopt;

    for (int cardIndex = tableauPile.getCards().size() - 1; cardIndex >= 0; --cardIndex)
        if (collidesWithCardYPosition(position, cardIndex))
            return cardIndex;

    return std::nullopt;
}